

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::FieldDescriptorProto::_InternalParse
          (FieldDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  byte *pbVar1;
  int number;
  bool bVar2;
  string *s;
  FieldOptions *msg;
  uint64 uVar3;
  UnknownFieldSet *this_00;
  char cVar4;
  uint uVar5;
  char *local_48;
  uint32 tag;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  uVar5 = 0;
  local_48 = ptr;
LAB_00347530:
  do {
    bVar2 = internal::ParseContext::Done(ctx,&local_48);
    if (bVar2) goto LAB_0034772a;
    local_48 = internal::ReadTag(local_48,&tag,0);
    if (local_48 == (char *)0x0) goto LAB_00347745;
    cVar4 = (char)tag;
    switch(tag >> 3) {
    case 1:
      if (cVar4 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(this);
LAB_00347691:
      local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
      goto joined_r0x003476cf;
    case 2:
      if (cVar4 == '\x12') {
        s = _internal_mutable_extendee_abi_cxx11_(this);
        goto LAB_00347691;
      }
      break;
    case 3:
      if (cVar4 == '\x18') {
        uVar5 = uVar5 | 0x40;
        uVar3 = internal::ReadVarint(&local_48);
        this->number_ = (int32)uVar3;
        goto joined_r0x003476cf;
      }
      break;
    case 4:
      if (cVar4 == ' ') {
        uVar3 = internal::ReadVarint(&local_48);
        if (local_48 == (char *)0x0) goto LAB_00347745;
        if ((int)uVar3 - 1U < 3) {
          pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar1 = *pbVar1 | 1;
          this->label_ = (int)uVar3;
        }
        else {
          this_00 = mutable_unknown_fields(this);
          number = 4;
LAB_00347713:
          UnknownFieldSet::AddVarint(this_00,number,uVar3);
        }
        goto LAB_00347530;
      }
      break;
    case 5:
      if (cVar4 == '(') {
        uVar3 = internal::ReadVarint(&local_48);
        if (local_48 == (char *)0x0) goto LAB_00347745;
        if (0x11 < (int)uVar3 - 1U) {
          this_00 = mutable_unknown_fields(this);
          number = 5;
          goto LAB_00347713;
        }
        pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 2;
        this->type_ = (int)uVar3;
        goto LAB_00347530;
      }
      break;
    case 6:
      if (cVar4 == '2') {
        s = _internal_mutable_type_name_abi_cxx11_(this);
        goto LAB_00347691;
      }
      break;
    case 7:
      if (cVar4 == ':') {
        s = _internal_mutable_default_value_abi_cxx11_(this);
        goto LAB_00347691;
      }
      break;
    case 8:
      if (cVar4 == 'B') {
        msg = _internal_mutable_options(this);
        local_48 = internal::ParseContext::ParseMessage<google::protobuf::FieldOptions>
                             (ctx,msg,local_48);
        goto joined_r0x003476cf;
      }
      break;
    case 9:
      if (cVar4 == 'H') {
        uVar5 = uVar5 | 0x80;
        uVar3 = internal::ReadVarint(&local_48);
        this->oneof_index_ = (int32)uVar3;
        goto joined_r0x003476cf;
      }
      break;
    case 10:
      if (cVar4 == 'R') {
        s = _internal_mutable_json_name_abi_cxx11_(this);
        goto LAB_00347691;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      goto LAB_0034772a;
    }
    local_48 = internal::UnknownFieldParse(tag,local_38,local_48,ctx);
joined_r0x003476cf:
    if (local_48 == (char *)0x0) {
LAB_00347745:
      local_48 = (char *)0x0;
LAB_0034772a:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar5;
      return local_48;
    }
  } while( true );
}

Assistant:

const char* FieldDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string extendee = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_extendee(), ptr, ctx, "google.protobuf.FieldDescriptorProto.extendee");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(val))) {
            _internal_set_label(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(4, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type_IsValid(val))) {
            _internal_set_type(static_cast<PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Type>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional string type_name = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_type_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.type_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string default_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_default_value(), ptr, ctx, "google.protobuf.FieldDescriptorProto.default_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 oneof_index = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 72)) {
          _Internal::set_has_oneof_index(&has_bits);
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_json_name(), ptr, ctx, "google.protobuf.FieldDescriptorProto.json_name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}